

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp_uint_t sexp_bignum_hi(sexp a)

{
  sexp_uint_t sVar1;
  sexp_uint_t sVar2;
  
  sVar1 = (a->value).string.offset;
  do {
    sVar2 = sVar1;
    if (sVar2 == 1) {
      return 1;
    }
    sVar1 = sVar2 - 1;
  } while (*(long *)((long)&a->value + sVar2 * 8 + 8) == 0);
  return sVar2;
}

Assistant:

sexp_uint_t sexp_bignum_hi (sexp a) {
  sexp_uint_t i=sexp_bignum_length(a)-1;
  while ((i>0) && ! sexp_bignum_data(a)[i])
    i--;
  return i+1;
}